

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::WeightParams::_internal_add_floatvalue(WeightParams *this,float value)

{
  float local_14;
  WeightParams *pWStack_10;
  float value_local;
  WeightParams *this_local;
  
  local_14 = value;
  pWStack_10 = this;
  google::protobuf::RepeatedField<float>::Add(&this->floatvalue_,&local_14);
  return;
}

Assistant:

inline void WeightParams::_internal_add_floatvalue(float value) {
  floatvalue_.Add(value);
}